

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Analysis.cpp
# Opt level: O1

void __thiscall
Analysis::UpdateParameterDict(Analysis *this,string *param_filename,int argc,char **argv)

{
  ParameterReader *this_00;
  pointer pcVar1;
  double dVar2;
  string local_90;
  string local_70;
  string local_50;
  
  this_00 = &this->paraRdr_;
  pcVar1 = (param_filename->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + param_filename->_M_string_length);
  ParameterReader::readFromFile(this_00,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"#","");
  ParameterReader::readFromArguments(this_00,(long)argc,argv,&local_70,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"readRapidityShiftFromFile","");
  dVar2 = ParameterReader::getVal(this_00,&local_90,0.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((dVar2 == 1.0) && (!NAN(dVar2))) {
    setRapiditySfhitFromFile(this);
  }
  ParameterReader::echo(this_00);
  return;
}

Assistant:

void Analysis::UpdateParameterDict(
    std::string param_filename, int argc, char *argv[]) {
    paraRdr_.readFromFile(param_filename);
    paraRdr_.readFromArguments(argc, argv);

    // rapidity shift from file
    if (paraRdr_.getVal("readRapidityShiftFromFile", 0) == 1) {
        setRapiditySfhitFromFile();
    }
    paraRdr_.echo();
}